

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::HttpServer::Connection::send(Connection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  StringPtr statusText;
  ArrayPtr<kj::StringPtr> AVar1;
  byte bVar2;
  bool bVar3;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> **ppOVar4;
  bool *pbVar5;
  uint statusCode;
  unsigned_long *params;
  undefined4 in_register_00000034;
  long lVar6;
  undefined4 in_register_00000084;
  anon_union_8_1_a8a2e026_for_OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_2 in_R9;
  Maybe<unsigned_long> *in_stack_00000008;
  byte local_30a;
  ArrayDisposer **local_2d0;
  undefined1 local_2a0 [32];
  _func_int **local_280;
  unsigned_long *s_1;
  unsigned_long *_s7931;
  uint local_25c;
  Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> local_258;
  ArrayPtr<const_kj::StringPtr> local_248;
  ExceptionOrValue *local_238;
  OnReadyEvent OStack_230;
  String local_228;
  ArrayPtr<kj::StringPtr> local_210;
  undefined1 local_1f9;
  undefined8 local_1f8;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  Maybe<kj::StringPtr> local_1e8 [2];
  Maybe<kj::StringPtr> local_1b8;
  undefined1 local_1a0 [8];
  ArrayPtr<kj::StringPtr> connectionHeadersArray;
  StringPtr local_180;
  String local_170;
  undefined8 local_158;
  unsigned_long *s;
  unsigned_long *_s7896;
  undefined8 local_140;
  bool local_132 [2];
  undefined1 local_130 [13];
  undefined1 local_123 [10];
  bool isHeadRequest;
  undefined8 local_118;
  undefined8 local_110;
  HttpServerCallbacks *c;
  HttpServerCallbacks *_c7869;
  String lengthStr;
  StringPtr connectionHeaders [7];
  Fault local_58;
  class_kj__Own_72 local_50;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *_kj_result;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> method;
  HttpHeaders *headers_local;
  uint statusCode_local;
  Connection *this_local;
  StringPtr statusText_local;
  
  lVar6 = CONCAT44(in_register_00000034,__fd);
  statusCode = (uint)__buf;
  method.field_1 = in_R9;
  local_50.PointerType =
       kj::_::readMaybe<kj::OneOf<kj::HttpMethod,kj::HttpConnectMethod>>
                 ((Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)(lVar6 + 0x148));
  if ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)local_50.PointerType ==
      (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1eae,FAILED,"currentMethod != nullptr","\"already called send()\"",
               (char (*) [22])"already called send()");
    kj::_::Debug::Fault::fatal(&local_58);
  }
  ppOVar4 = mv<kj::OneOf<kj::HttpMethod,kj::HttpConnectMethod>*>
                      ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> **)&local_50);
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::OneOf
            ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)&_kj_result,*ppOVar4);
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::operator=
            ((Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)(lVar6 + 0x148));
  local_2d0 = &lengthStr.content.disposer;
  do {
    StringPtr::StringPtr((StringPtr *)local_2d0);
    local_2d0 = local_2d0 + 2;
  } while (local_2d0 != (ArrayDisposer **)&connectionHeaders[6].content.size_);
  String::String((String *)&_c7869);
  if ((*(byte *)(lVar6 + 0x164) & 1) == 0) {
    if (((*(byte *)(*(long *)(lVar6 + 0x18) + 0x70) & 1) == 0) ||
       ((*(byte *)(lVar6 + 0x165) & 1) != 0)) {
      c = kj::_::readMaybe<kj::HttpServerCallbacks>
                    ((Maybe<kj::HttpServerCallbacks_&> *)(*(long *)(lVar6 + 0x18) + 0x58));
      if ((c != (HttpServerCallbacks *)0x0) &&
         (local_110 = c, bVar2 = (*(code *)**(undefined8 **)c)(), (bVar2 & 1) != 0)) {
        *(undefined1 *)(lVar6 + 0x164) = 1;
      }
    }
    else {
      *(undefined1 *)(lVar6 + 0x164) = 1;
    }
  }
  if ((*(byte *)(lVar6 + 0x164) & 1) != 0) {
    StringPtr::StringPtr((StringPtr *)(local_123 + 3),"close");
    lengthStr.content.disposer = (ArrayDisposer *)stack0xfffffffffffffee0;
    connectionHeaders[0].content.ptr = (char *)local_118;
  }
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::tryGet<kj::HttpMethod>
            ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)local_130);
  Maybe<kj::HttpMethod_&>::
  map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:7882:58)>
            ((Maybe<kj::HttpMethod_&> *)local_123,(anon_class_1_0_00000001 *)local_130);
  local_132[0] = false;
  pbVar5 = Maybe<bool>::orDefault((Maybe<bool> *)local_123,local_132);
  bVar3 = *pbVar5;
  Maybe<bool>::~Maybe((Maybe<bool> *)local_123);
  local_123[2] = bVar3 & 1;
  if ((statusCode != 0xcc) && (statusCode != 0x130)) {
    if (statusCode == 0xcd) {
      StringPtr::StringPtr((StringPtr *)&_s7896,"0");
      connectionHeaders[4].content.size_ = (size_t)_s7896;
      connectionHeaders[5].content.ptr = (char *)local_140;
    }
    else {
      s = kj::_::readMaybe<unsigned_long>(in_stack_00000008);
      if ((kj *)s == (kj *)0x0) {
        StringPtr::StringPtr((StringPtr *)&connectionHeadersArray.size_,"chunked");
        connectionHeaders[5].content.size_ = connectionHeadersArray.size_;
      }
      else {
        local_158 = s;
        if (((local_123[2] & 1) == 0) || (((kj *)s)->__resume_fn != (void *)0x0)) {
          str<unsigned_long&>(&local_170,(kj *)s,params);
          String::operator=((String *)&_c7869,&local_170);
          String::~String(&local_170);
          StringPtr::StringPtr(&local_180,(String *)&_c7869);
          connectionHeaders[4].content.size_ = (size_t)local_180.content.ptr;
          connectionHeaders[5].content.ptr = (char *)local_180.content.size_;
        }
      }
    }
  }
  ArrayPtr<kj::StringPtr>::ArrayPtr<7ul>
            ((ArrayPtr<kj::StringPtr> *)local_1a0,(StringPtr (*) [7])&lengthStr.content.disposer);
  AVar1.size_ = (size_t)connectionHeadersArray.ptr;
  AVar1.ptr = (StringPtr *)local_1a0;
  if ((local_123[2] & 1) != 0) {
    local_1e8[1].ptr.field_1._0_8_ = 0;
    local_1e8[1].ptr.field_1._8_4_ = 5;
    local_1e8[1].ptr.field_1._12_4_ = 0;
    local_1f9 = 0;
    HttpHeaders::get(&local_1b8,(HttpHeaders *)method.field_1,(HttpHeaderId)(ZEXT416(5) << 0x40));
    bVar3 = Maybe<kj::StringPtr>::operator==(&local_1b8);
    local_30a = 1;
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      local_1f8 = 0;
      uStack_1f0 = 6;
      uStack_1ec = 0;
      HttpHeaders::get(local_1e8,(HttpHeaders *)method.field_1,(HttpHeaderId)(ZEXT416(6) << 0x40));
      local_1f9 = 1;
      bVar3 = Maybe<kj::StringPtr>::operator==(local_1e8);
      local_30a = bVar3 ^ 0xff;
    }
    if ((local_1f9 & 1) != 0) {
      Maybe<kj::StringPtr>::~Maybe(local_1e8);
    }
    Maybe<kj::StringPtr>::~Maybe(&local_1b8);
    AVar1.size_ = (size_t)connectionHeadersArray.ptr;
    AVar1.ptr = (StringPtr *)local_1a0;
    if ((local_30a & 1) != 0) {
      local_210 = ArrayPtr<kj::StringPtr>::first((ArrayPtr<kj::StringPtr> *)local_1a0,5);
      AVar1 = local_210;
    }
  }
  connectionHeadersArray.ptr = (StringPtr *)AVar1.size_;
  local_1a0 = (undefined1  [8])AVar1.ptr;
  local_238 = (ExceptionOrValue *)__n;
  OStack_230.event = (Event *)CONCAT44(in_register_00000084,__flags);
  local_248 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)local_1a0);
  statusText.content.size_ = (size_t)OStack_230.event;
  statusText.content.ptr = (char *)local_238;
  HttpHeaders::serializeResponse
            (&local_228,(HttpHeaders *)method.field_1,statusCode,statusText,local_248);
  anon_unknown_36::HttpOutputStream::writeHeaders((HttpOutputStream *)(lVar6 + 0x128),&local_228);
  String::~String(&local_228);
  if ((local_123[2] & 1) == 0) {
    if (((statusCode == 0xcc) || (statusCode == 0xcd)) || (statusCode == 0x130)) {
      anon_unknown_36::HttpOutputStream::finishBody((HttpOutputStream *)(lVar6 + 0x128));
      heap<kj::(anonymous_namespace)::HttpNullEntityWriter>();
      Own<kj::AsyncOutputStream,decltype(nullptr)>::
      Own<kj::(anonymous_namespace)::HttpNullEntityWriter,void>
                ((Own<kj::AsyncOutputStream,decltype(nullptr)> *)this,
                 (Own<kj::(anonymous_namespace)::HttpNullEntityWriter,_std::nullptr_t> *)&_s7931);
      Own<kj::(anonymous_namespace)::HttpNullEntityWriter,_std::nullptr_t>::~Own
                ((Own<kj::(anonymous_namespace)::HttpNullEntityWriter,_std::nullptr_t> *)&_s7931);
    }
    else {
      s_1 = kj::_::readMaybe<unsigned_long>(in_stack_00000008);
      if ((_func_int **)s_1 == (_func_int **)0x0) {
        heap<kj::(anonymous_namespace)::HttpChunkedEntityWriter,kj::(anonymous_namespace)::HttpOutputStream&>
                  ((kj *)local_2a0,(HttpOutputStream *)(lVar6 + 0x128));
        Own<kj::AsyncOutputStream,decltype(nullptr)>::
        Own<kj::(anonymous_namespace)::HttpChunkedEntityWriter,void>
                  ((Own<kj::AsyncOutputStream,decltype(nullptr)> *)this,
                   (Own<kj::(anonymous_namespace)::HttpChunkedEntityWriter,_std::nullptr_t> *)
                   local_2a0);
        Own<kj::(anonymous_namespace)::HttpChunkedEntityWriter,_std::nullptr_t>::~Own
                  ((Own<kj::(anonymous_namespace)::HttpChunkedEntityWriter,_std::nullptr_t> *)
                   local_2a0);
      }
      else {
        local_280 = (_func_int **)s_1;
        heap<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter,kj::(anonymous_namespace)::HttpOutputStream&,unsigned_long&>
                  ((kj *)(local_2a0 + 0x10),(HttpOutputStream *)(lVar6 + 0x128),s_1);
        Own<kj::AsyncOutputStream,decltype(nullptr)>::
        Own<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter,void>
                  ((Own<kj::AsyncOutputStream,decltype(nullptr)> *)this,
                   (Own<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter,_std::nullptr_t> *)
                   (local_2a0 + 0x10));
        Own<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter,_std::nullptr_t>::~Own
                  ((Own<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter,_std::nullptr_t> *)
                   (local_2a0 + 0x10));
      }
    }
  }
  else {
    anon_unknown_36::HttpOutputStream::finishBody((HttpOutputStream *)(lVar6 + 0x128));
    heap<kj::(anonymous_namespace)::HttpDiscardingEntityWriter>();
    Own<kj::AsyncOutputStream,decltype(nullptr)>::
    Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,void>
              ((Own<kj::AsyncOutputStream,decltype(nullptr)> *)this,&local_258);
    Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>::~Own(&local_258);
  }
  local_25c = 1;
  String::~String((String *)&_c7869);
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf
            ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)&_kj_result);
  return (ssize_t)this;
}

Assistant:

kj::Own<kj::AsyncOutputStream> send(
      uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers,
      kj::Maybe<uint64_t> expectedBodySize) override {
    auto method = KJ_REQUIRE_NONNULL(currentMethod, "already called send()");
    currentMethod = kj::none;

    kj::StringPtr connectionHeaders[HttpHeaders::CONNECTION_HEADERS_COUNT];
    kj::String lengthStr;

    if (!closeAfterSend) {
      // Check if application wants us to close connections.
      //
      // If the application used listenHttpCleanDrain() to listen, then it expects that after a
      // clean drain, the connection is still open and can receive more requests. Otherwise, after
      // receiving drain(), we will close the connection, so we should send a `Connection: close`
      // header.
      if (server.draining && !wantCleanDrain) {
        closeAfterSend = true;
      } else KJ_IF_SOME(c, server.settings.callbacks) {
        // The application has registered its own callback to decide whether to send
        // `Connection: close`.
        if (c.shouldClose()) {
          closeAfterSend = true;
        }
      }
    }

    if (closeAfterSend) {
      connectionHeaders[HttpHeaders::BuiltinIndices::CONNECTION] = "close";
    }

    bool isHeadRequest = method.tryGet<HttpMethod>().map([](auto& m) {
        return m == HttpMethod::HEAD;
      }).orDefault(false);

    if (statusCode == 204 || statusCode == 304) {
      // No entity-body.
    } else if (statusCode == 205) {
      // Status code 205 also has no body, but unlike 204 and 304, it must explicitly encode an
      // empty body, e.g. using content-length: 0. I'm guessing this is one of those things,
      // where some early clients expected an explicit body while others assumed an empty body,
      // and so the standard had to choose the common denominator.
      //
      // Spec: https://tools.ietf.org/html/rfc7231#section-6.3.6
      connectionHeaders[HttpHeaders::BuiltinIndices::CONTENT_LENGTH] = "0";
    } else KJ_IF_SOME(s, expectedBodySize) {
      // HACK: We interpret a zero-length expected body length on responses to HEAD requests to
      //   mean "don't set a Content-Length header at all." This provides a way to omit a body
      //   header on HEAD responses with non-null-body status codes. This is a hack that *only*
      //   makes sense for HEAD responses.
      if (!isHeadRequest || s > 0) {
        lengthStr = kj::str(s);
        connectionHeaders[HttpHeaders::BuiltinIndices::CONTENT_LENGTH] = lengthStr;
      }
    } else {
      connectionHeaders[HttpHeaders::BuiltinIndices::TRANSFER_ENCODING] = "chunked";
    }